

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForScalarVectorField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string struct_type;
  string field_method;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&field_method,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&struct_type,pIVar1,struct_def);
  GenIndents_abi_cxx11_(&local_110,this,2);
  std::operator+(&local_130,&local_110,"if self.");
  std::operator+(&local_170,&local_130,&field_field);
  std::operator+(&local_150,&local_170," is not None:");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  GenIndents_abi_cxx11_(&local_b0,this,3);
  std::operator+(&local_90,&local_b0,&struct_type);
  std::operator+(&local_d0,&local_90,"Add");
  std::operator+(&local_110,&local_d0,&field_method);
  std::operator+(&local_130,&local_110,"(builder, ");
  std::operator+(&local_170,&local_130,&field_field);
  std::operator+(&local_150,&local_170,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  GenIndents_abi_cxx11_(&local_110,this,2);
  std::operator+(&local_130,&local_110,"if self.");
  std::operator+(&local_170,&local_130,&field_field);
  std::operator+(&local_150,&local_170," is not None:");
  std::__cxx11::string::append((string *)code_prefix_ptr);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  if ((field->value).type.element == BASE_TYPE_STRING) {
    GenIndents_abi_cxx11_(&local_130,this,3);
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170,"list = []");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    GenIndents_abi_cxx11_(&local_110,this,3);
    std::operator+(&local_130,&local_110,"for i in range(len(self.");
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170,")):");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    GenIndents_abi_cxx11_(&local_d0,this,4);
    std::operator+(&local_110,&local_d0,&field_field);
    std::operator+(&local_130,&local_110,"list.append(builder.CreateString(self.");
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170,"[i]))");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,3);
    std::operator+(&local_170,"(",&field_field);
    std::operator+(&local_150,&local_170,"list[i])");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenIndents_abi_cxx11_(&local_130,this,3);
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170," = builder.EndVector()");
    std::__cxx11::string::append((string *)code_prefix_ptr);
  }
  else if ((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy == true) {
    GenIndents_abi_cxx11_(&local_110,this,3);
    std::operator+(&local_130,&local_110,"if np is not None and type(self.");
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170,") is np.ndarray:");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    GenIndents_abi_cxx11_(&local_d0,this,4);
    std::operator+(&local_110,&local_d0,&field_field);
    std::operator+(&local_130,&local_110," = builder.CreateNumpyVector(self.");
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170,")");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    GenIndents_abi_cxx11_(&local_170,this,3);
    std::operator+(&local_150,&local_170,"else:");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,4);
    std::operator+(&local_170,"(self.",&field_field);
    std::operator+(&local_150,&local_170,"[i])");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenIndents_abi_cxx11_(&local_130,this,4);
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170," = builder.EndVector()");
    std::__cxx11::string::append((string *)code_prefix_ptr);
  }
  else {
    GenPackForScalarVectorFieldHelper(this,struct_def,field,code_prefix_ptr,3);
    std::operator+(&local_170,"(self.",&field_field);
    std::operator+(&local_150,&local_170,"[i])");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenIndents_abi_cxx11_(&local_130,this,4);
    std::operator+(&local_170,&local_130,&field_field);
    std::operator+(&local_150,&local_170," = builder.EndVector()");
    std::__cxx11::string::append((string *)code_prefix_ptr);
  }
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&struct_type);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void GenPackForScalarVectorField(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_prefix_ptr,
                                   std::string *code_ptr) const {
    auto &code = *code_ptr;
    auto &code_prefix = *code_prefix_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    // Adds the field into the struct.
    code += GenIndents(2) + "if self." + field_field + " is not None:";
    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";

    // Creates the field.
    code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
    // If the vector is a string vector, we need to first build accessor for
    // each string element. And this generated code, needs to be
    // placed ahead of code_prefix.
    auto vectortype = field.value.type.VectorType();
    if (IsString(vectortype)) {
      code_prefix += GenIndents(3) + field_field + "list = []";
      code_prefix +=
          GenIndents(3) + "for i in range(len(self." + field_field + ")):";
      code_prefix += GenIndents(4) + field_field +
                     "list.append(builder.CreateString(self." + field_field +
                     "[i]))";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(" + field_field + "list[i])";
      code_prefix += GenIndents(3) + field_field + " = builder.EndVector()";
      return;
    }

    if (parser_.opts.python_gen_numpy) {
      code_prefix += GenIndents(3) + "if np is not None and type(self." +
                    field_field + ") is np.ndarray:";
      code_prefix += GenIndents(4) + field_field +
                    " = builder.CreateNumpyVector(self." + field_field + ")";
      code_prefix += GenIndents(3) + "else:";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 4);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    } else {
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    }
  }